

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  Descriptor *pDVar4;
  iterator iter;
  slot_type *psVar5;
  slot_type *psVar6;
  bool bVar7;
  slot_type *psVar8;
  Descriptor **key;
  tuple<> tStack_31;
  tuple<const_google::protobuf::Descriptor_*const_&> tStack_30;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10) || psVar1 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)(kEmptyGroup + 0x10) && psVar2 != (slot_type *)0x0) &&
       (*(ctrl_t *)psVar2 < ~kSentinel)) goto LAB_0023897e;
    if (psVar1 == (slot_type *)(kEmptyGroup + 0x10) && psVar2 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_00238971:
      return psVar1 == psVar2;
    }
    if ((psVar1 == (slot_type *)(kEmptyGroup + 0x10)) !=
        (psVar2 == (slot_type *)(kEmptyGroup + 0x10))) goto LAB_00238983;
    if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_00238971;
    if ((psVar2 == (slot_type *)kSooControl) == (psVar1 == (slot_type *)kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar3 = (b->field_1).slot_;
      if (psVar1 == (slot_type *)kSooControl) {
        bVar7 = (slot_type *)a == psVar3;
      }
      else {
        psVar8 = psVar3;
        psVar5 = psVar2;
        psVar6 = (slot_type *)a;
        if (psVar2 < psVar1) {
          psVar8 = (slot_type *)a;
          psVar5 = psVar1;
          psVar6 = psVar3;
        }
        b = (iterator *)CONCAT71((int7)((ulong)psVar5 >> 8),psVar5 < psVar6);
        bVar7 = psVar6 <= psVar8 && psVar5 < psVar6;
      }
      if (bVar7) goto LAB_00238971;
    }
  }
  else {
    operator==();
LAB_0023897e:
    operator==();
LAB_00238983:
    operator==();
  }
  operator==();
  pDVar4 = ((value_type *)a)->first;
  if (pDVar4 == (Descriptor *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pDVar4 != (Descriptor *)(kEmptyGroup + 0x10)) {
    if (-1 < (char)(pDVar4->super_SymbolBase).symbol_type_) {
      return SUB81(((value_type *)a)->second,0);
    }
    goto LAB_002389bc;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
  ::iterator::operator*((iterator *)a);
LAB_002389bc:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
  ::iterator::operator*((iterator *)a);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
  ::find_or_prepare_insert<google::protobuf::Descriptor_const*>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>::iterator,_bool>
              *)a,(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
                   *)b,key);
  if (*(char *)((slot_type *)a + 1) == '\x01') {
    iter.ctrl_ = (ctrl_t *)*(Descriptor **)a;
    iter.field_1 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)a + 8);
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::Descriptor_const*const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
                *)b,iter,(piecewise_construct_t *)&std::piecewise_construct,&tStack_30,&tStack_31);
  }
  return SUB81(a,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }